

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.h
# Opt level: O1

void __thiscall XTreeNode::removeElements(XTreeNode *this)

{
  QMapData<std::map<QString,_XTreeNode_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_XTreeNode_*>_>_>_>
  *pQVar1;
  _Rb_tree_node_base *p_Var2;
  const_iterator r;
  _Rb_tree_node_base *p_Var3;
  
  pQVar1 = (this->children).d.d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_XTreeNode_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_XTreeNode_*>_>_>_>
                 *)0x0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QString,_XTreeNode_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_XTreeNode_*>_>_>_>
                 *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var2 != p_Var3; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    (**(code **)(*(long *)p_Var2[1]._M_right + 0x18))();
    if (p_Var2[1]._M_right != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_right + 8))();
    }
  }
  QMap<QString,_XTreeNode_*>::clear(&this->children);
  return;
}

Assistant:

void removeElements() override {
        ChildrenMap::ConstIterator it = children.constBegin();
        ChildrenMap::ConstIterator end = children.constEnd();
        for( ; it != end; it++) {
            (*it)->removeElements();
            delete it.value();
        }
        children.clear();
    }